

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O0

void * cod_ev_get_data(cod_exec_context ec,int absp,int queue,int index)

{
  int absp_00;
  queue_item *pqVar1;
  event_item *peVar2;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  CManager_conflict in_RDI;
  queue_item *item;
  ev_state_data *ev_state;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  ev_state_data *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  void *local_8;
  
  cod_get_client_data(in_RDI,0x34567890);
  pqVar1 = cod_find_index(absp_00,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc8);
  if (pqVar1 == (queue_item *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    if (pqVar1->item == (event_item *)0x0) {
      __assert_fail("item->item",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x3b8,"void *cod_ev_get_data(cod_exec_context, int, int, int)");
    }
    if (pqVar1->item->decoded_event == (void *)0x0) {
      peVar2 = cod_decode_event(in_RDI,in_ESI,in_EDX,
                                (event_item *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0));
      pqVar1->item = peVar2;
    }
    if (pqVar1->item->decoded_event == (void *)0x0) {
      __assert_fail("item->item->decoded_event",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/response.c"
                    ,0x3be,"void *cod_ev_get_data(cod_exec_context, int, int, int)");
    }
    local_8 = pqVar1->item->decoded_event;
  }
  return local_8;
}

Assistant:

static void *cod_ev_get_data(cod_exec_context ec, int absp, int queue, int index)
{
    struct ev_state_data *ev_state = (void*)cod_get_client_data(ec, 0x34567890);
    queue_item *item;
    item = cod_find_index(absp, ev_state, queue, index);

    if (!item) {
	return NULL;
    }
    assert(item->item);

    if (!item->item->decoded_event) {
        item->item = cod_decode_event(ev_state->cm, ev_state->stone,
				      ev_state->proto_action_id, item->item);
    }
    assert(item->item->decoded_event);

    return item->item->decoded_event;
}